

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::AssertionHandler::handleExpr<FIX::GapFillFlag&>
          (AssertionHandler *this,ExprLhs<FIX::GapFillFlag_&> *expr)

{
  GapFillFlag *this_00;
  ITransientExpression local_28;
  GapFillFlag *local_18;
  
  this_00 = expr->m_lhs;
  local_28.m_result = FIX::BoolField::getValue(&this_00->super_BoolField);
  local_28.m_isBinaryExpression = false;
  local_28._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00327870;
  local_18 = this_00;
  handleExpr(this,&local_28);
  ITransientExpression::~ITransientExpression(&local_28);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }